

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int read_dns_answer(answer *dest,char *src,char *message_start,_Bool *good)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  ushort *__src;
  ushort *local_30;
  
  local_30 = (ushort *)src;
  iVar3 = fetch_label(dest->name,src,message_start,(char **)&local_30);
  if (good != (_Bool *)0x0) {
    *good = false;
  }
  if (iVar3 == -1) {
    iVar3 = -1;
  }
  else {
    uVar1 = *(uint *)(local_30 + 2);
    dest->ttl = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    dest->class_ = local_30[1] << 8 | local_30[1] >> 8;
    uVar2 = *local_30 << 8 | *local_30 >> 8;
    dest->type = uVar2;
    uVar4 = local_30[4] << 8 | local_30[4] >> 8;
    __src = local_30 + 5;
    if ((uVar2 == 0x1c) || (uVar2 == 1)) {
      local_30 = __src;
      memcpy(&dest->address,__src,(ulong)uVar4);
      (dest->address).type = (uchar)dest->type;
      if (good != (_Bool *)0x0) {
        *good = true;
      }
    }
    iVar3 = ((int)__src + (uint)uVar4) - (int)src;
  }
  return iVar3;
}

Assistant:

int read_dns_answer(struct answer *dest, char *src, char *message_start,bool* good) {
  char *src_ = src;
    // printf("------------\nsrc = %d\n",src - message_start);fflush(stdout);
  int cnt = fetch_label((char *)&(dest->name), src, message_start, &src);
  if(good)*good=false;
  if (cnt == -1){
    return -1;
  }
  struct answer_struct *answer_struct = (struct answer_struct *)(src);
  dest->ttl = ntohl(answer_struct->ttl);
  dest->class_ = ntohs(answer_struct->class_);
  dest->type = ntohs(answer_struct->type);
  uint16_t length = ntohs(answer_struct->length);
  src += sizeof(struct answer_struct);
  // printf("dest->type:%d ,length=%d\n",dest->type,length);
  switch (dest->type) {
  case RRTYPE_A:
  case RRTYPE_AAAA:
    memcpy(&dest->address.addr,src,length);
    dest->address.type =dest->type;
    if(good)*good=true;
    break;
  case RRTYPE_CNAME:
    //  直接存为A record
    // dest->cname = (char*) malloc(80);
    // fetch_label(dest->cname, src, message_start, NULL);
    break;
  case RRTYPE_MX:
    //预留，不支持
    // return -1;
    // next = 0;
    break;
  default:
    // 预留，不支持
    // return -1;
    // next = 0;
    break;
  }
  src += length;//前面加1了，这边就加length-1
  // printf("src = %d\n",src - message_start);fflush(stdout);  
  return src - src_;
}